

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O2

Fraction operator+(int *a,Fraction *b)

{
  Fraction current_frac;
  Fraction local_10;
  
  local_10.denominator_ = (*b).denominator_;
  local_10.numerator_ = (*b).numerator_ + local_10.denominator_ * *a;
  Fraction::Normalization(&local_10);
  return local_10;
}

Assistant:

Fraction operator+(const int& a, const Fraction& b) {
  Fraction current_frac = b;
  current_frac.numerator_ += b.denominator_ * a;
  current_frac.Normalization();
  return current_frac;
}